

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeNormalizedCase::test
          (VertexAttributeNormalizedCase *this)

{
  CallLogWrapper *this_00;
  TestLog *pTVar1;
  long lVar2;
  GLenum GVar3;
  ScopedLogSection section;
  GLfloat vertexData [4];
  PointerData pointers [16];
  ScopedLogSection local_1e0;
  string local_1d8;
  string local_1b8;
  undefined4 local_198;
  undefined1 local_194;
  string *local_190;
  undefined8 local_188;
  undefined4 local_180;
  undefined1 local_17c;
  string *local_178;
  undefined8 local_170;
  undefined4 local_168;
  undefined1 local_164;
  string *local_160;
  undefined8 local_158;
  undefined4 local_150;
  undefined1 local_14c;
  string *local_148;
  undefined8 local_140;
  undefined4 local_138;
  undefined1 local_134;
  string *local_130;
  undefined8 local_128;
  undefined4 local_120;
  undefined1 local_11c;
  string *local_118;
  undefined8 local_110;
  undefined4 local_108;
  undefined1 local_104;
  string *local_100;
  undefined8 local_f8;
  undefined4 local_f0;
  undefined1 local_ec;
  string *local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined1 local_d4;
  string *local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined1 local_bc;
  string *local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined1 local_a4;
  string *local_a0;
  undefined8 local_98;
  undefined4 local_90;
  undefined1 local_8c;
  string *local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined1 local_74;
  string *local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined1 local_5c;
  string *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined1 local_44;
  string *local_40;
  
  pTVar1 = (this->super_ApiCase).m_log;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"DefaultVAO","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Test with default VAO","");
  tcu::ScopedLogSection::ScopedLogSection(&local_1e0,pTVar1,&local_1b8,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,local_1b8.field_2._M_allocated_capacity + 1);
  }
  local_1d8._M_dataplus._M_p = (pointer)0x0;
  local_1d8._M_string_length = 0;
  local_1b8._M_dataplus._M_p = (pointer)0x140000000001;
  local_1b8._M_string_length._0_4_ = 0;
  local_1b8._M_string_length._4_1_ = 0;
  local_1b8.field_2._M_allocated_capacity = (size_type)&local_1d8;
  local_1b8.field_2._8_8_ = 0x140200000001;
  local_198 = 0;
  local_194 = 0;
  local_190 = &local_1d8;
  local_188 = 0x140400000001;
  local_180 = 0;
  local_17c = 0;
  local_178 = &local_1d8;
  local_170 = 0x140100000001;
  local_168 = 0;
  local_164 = 0;
  local_160 = &local_1d8;
  local_158 = 0x140300000001;
  local_150 = 0;
  local_14c = 0;
  local_148 = &local_1d8;
  local_140 = 0x140500000001;
  local_138 = 0;
  local_134 = 0;
  local_130 = &local_1d8;
  local_128 = 0x8d9f00000004;
  local_120 = 0;
  local_11c = 0;
  local_118 = &local_1d8;
  local_110 = 0x836800000004;
  local_108 = 0;
  local_104 = 0;
  local_100 = &local_1d8;
  local_f8 = 0x140000000001;
  local_f0 = 0;
  local_ec = 1;
  local_e8 = &local_1d8;
  local_e0 = 0x140200000001;
  local_d8 = 0;
  local_d4 = 1;
  local_d0 = &local_1d8;
  local_c8 = 0x140400000001;
  local_c0 = 0;
  local_bc = 1;
  local_b8 = &local_1d8;
  local_b0 = 0x140100000001;
  local_a8 = 0;
  local_a4 = 1;
  local_a0 = &local_1d8;
  local_98 = 0x140300000001;
  local_90 = 0;
  local_8c = 1;
  local_88 = &local_1d8;
  local_80 = 0x140500000001;
  local_78 = 0;
  local_74 = 1;
  local_70 = &local_1d8;
  local_68 = 0x8d9f00000004;
  local_60 = 0;
  local_5c = 1;
  local_58 = &local_1d8;
  local_50 = 0x836800000004;
  local_48 = 0;
  local_44 = 1;
  local_40 = &local_1d8;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  lVar2 = 0x10;
  do {
    GVar3 = (GLenum)(byte)local_1d8.field_2._M_local_buf[lVar2 + 0xc];
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,0,*(GLint *)((long)&local_1d8.field_2 + lVar2),
               *(GLenum *)((long)&local_1d8.field_2 + lVar2 + 4),
               local_1d8.field_2._M_local_buf[lVar2 + 0xc],
               *(GLsizei *)((long)&local_1d8.field_2 + lVar2 + 8),
               *(void **)((long)&local_1b8._M_dataplus._M_p + lVar2));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x886a,(uint)(byte)local_1d8.field_2._M_local_buf[lVar2 + 0xc],GVar3)
    ;
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 400);
  local_1b8._M_dataplus._M_p = (pointer)0x140000000001;
  local_1b8._M_string_length._0_4_ = 0;
  local_1b8._M_string_length._4_1_ = 0;
  local_1b8.field_2._M_allocated_capacity = (size_type)&local_1d8;
  local_1b8.field_2._8_8_ = 0x140200000001;
  local_198 = 0;
  local_194 = 0;
  local_190 = &local_1d8;
  local_188 = 0x140400000001;
  local_180 = 0;
  local_17c = 0;
  local_178 = &local_1d8;
  local_170 = 0x140100000001;
  local_168 = 0;
  local_164 = 0;
  local_160 = &local_1d8;
  local_158 = 0x140300000001;
  local_150 = 0;
  local_14c = 0;
  local_148 = &local_1d8;
  local_140 = 0x140500000001;
  local_138 = 0;
  local_134 = 0;
  local_130 = &local_1d8;
  lVar2 = 0x10;
  do {
    GVar3 = *(GLenum *)((long)&local_1d8.field_2 + lVar2 + 8);
    glu::CallLogWrapper::glVertexAttribIPointer
              (this_00,0,*(GLint *)((long)&local_1d8.field_2 + lVar2),
               *(GLenum *)((long)&local_1d8.field_2 + lVar2 + 4),GVar3,
               *(void **)((long)&local_1b8._M_dataplus._M_p + lVar2));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x886a,0,GVar3);
    lVar2 = lVar2 + 0x18;
  } while (lVar2 != 0xa0);
  tcu::TestLog::endSection(local_1e0.m_log);
  pTVar1 = (this->super_ApiCase).m_log;
  local_1b8._M_dataplus._M_p = (pointer)&local_1b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,"WithVAO","");
  local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"Test with VAO","");
  tcu::ScopedLogSection::ScopedLogSection(&local_1e0,pTVar1,&local_1b8,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b8._M_dataplus._M_p != &local_1b8.field_2) {
    operator_delete(local_1b8._M_dataplus._M_p,(ulong)(local_1b8.field_2._M_allocated_capacity + 1))
    ;
  }
  local_1d8._M_dataplus._M_p = local_1d8._M_dataplus._M_p & 0xffffffff00000000;
  local_1b8._M_dataplus._M_p = (pointer)0x0;
  glu::CallLogWrapper::glGenVertexArrays(this_00,2,(GLuint *)&local_1b8);
  glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)&local_1d8);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,(GLuint)local_1d8._M_dataplus._M_p);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,(GLuint)local_1b8._M_dataplus._M_p);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x886a,0,GVar3);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,1,0x1404,'\x01',0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,local_1b8._M_dataplus._M_p._4_4_);
  GVar3 = 0;
  glu::CallLogWrapper::glVertexAttribPointer(this_00,0,1,0x1404,'\0',0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x886a,0,GVar3);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,(GLuint)local_1b8._M_dataplus._M_p);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x886a,1,GVar3);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,2,(GLuint *)&local_1b8);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)&local_1d8);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::TestLog::endSection(local_1e0.m_log);
  return;
}

Assistant:

void test (void)
	{
		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			const GLfloat vertexData[4] = {0.0f}; // never accessed

			// test VertexAttribPointer
			{
				const PointerData pointers[] =
				{
					{ 1, GL_BYTE,								0,	GL_FALSE,	vertexData	},
					{ 1, GL_SHORT,								0,	GL_FALSE,	vertexData	},
					{ 1, GL_INT,								0,	GL_FALSE,	vertexData	},
					{ 1, GL_UNSIGNED_BYTE,						0,	GL_FALSE,	vertexData	},
					{ 1, GL_UNSIGNED_SHORT,						0,	GL_FALSE,	vertexData	},
					{ 1, GL_UNSIGNED_INT,						0,	GL_FALSE,	vertexData	},
					{ 4, GL_INT_2_10_10_10_REV,					0,	GL_FALSE,	vertexData	},
					{ 4, GL_UNSIGNED_INT_2_10_10_10_REV,		0,	GL_FALSE,	vertexData	},
					{ 1, GL_BYTE,								0,	GL_TRUE,	vertexData	},
					{ 1, GL_SHORT,								0,	GL_TRUE,	vertexData	},
					{ 1, GL_INT,								0,	GL_TRUE,	vertexData	},
					{ 1, GL_UNSIGNED_BYTE,						0,	GL_TRUE,	vertexData	},
					{ 1, GL_UNSIGNED_SHORT,						0,	GL_TRUE,	vertexData	},
					{ 1, GL_UNSIGNED_INT,						0,	GL_TRUE,	vertexData	},
					{ 4, GL_INT_2_10_10_10_REV,					0,	GL_TRUE,	vertexData	},
					{ 4, GL_UNSIGNED_INT_2_10_10_10_REV,		0,	GL_TRUE,	vertexData	},
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].normalized, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, pointers[ndx].normalized);
				}
			}

			// test glVertexAttribIPointer
			{
				const PointerData pointers[] =
				{
					{ 1, GL_BYTE,				0,	GL_FALSE, vertexData	},
					{ 1, GL_SHORT,				0,	GL_FALSE, vertexData	},
					{ 1, GL_INT,				0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_BYTE,		0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_SHORT,		0,	GL_FALSE, vertexData	},
					{ 1, GL_UNSIGNED_INT,		0,	GL_FALSE, vertexData	},
				};

				for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
				{
					glVertexAttribIPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].stride, pointers[ndx].pointer);
					expectError(GL_NO_ERROR);

					verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, GL_FALSE);
				}
			}
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint buf		= 0;
			GLuint vaos[2]	= {0};

			glGenVertexArrays(2, vaos);
			glGenBuffers(1, &buf);
			glBindBuffer(GL_ARRAY_BUFFER, buf);
			expectError(GL_NO_ERROR);

			// initial
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, GL_FALSE);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glVertexAttribPointer(0, 1, GL_INT, GL_TRUE, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glVertexAttribPointer(0, 1, GL_INT, GL_FALSE, 0, DE_NULL);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, GL_FALSE);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, GL_TRUE);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			glDeleteBuffers(1, &buf);
			expectError(GL_NO_ERROR);
		}
	}